

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O1

void addTemporary(char *name)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = strdup(tokenBuffer);
  if (pcVar1 == (char *)0x0) {
    error_impl("addTemporary",0x3bd,"addTemporary(): malloc failure!");
  }
  lVar2 = (long)tempTop;
  tempTop = tempTop + 1;
  tempBuffer[lVar2] = pcVar1;
  if (0x1f2 < lVar2) {
    error_impl("addTemporary",0x3c3,"addTemporary(): too many temporaries!");
  }
  if (maxTemp < tempTop) {
    maxTemp = tempTop;
  }
  return;
}

Assistant:

void addTemporary(char *name)
{
    char *p;

    p = strdup(name);
    if (!p) {
        error("addTemporary(): malloc failure!");
    }

    tempBuffer[tempTop++] = p;

    if(tempTop >= TempBufferTop) {
        error("addTemporary(): too many temporaries!");
    }

    if (tempTop > maxTemp) {
        maxTemp = tempTop;
    }
}